

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<9,_0,_5,_0,_94>::evaluate
               (ShaderEvalContext *evalCtx)

{
  int i;
  undefined8 *puVar1;
  float *pfVar2;
  long lVar3;
  undefined4 *puVar4;
  int col;
  long lVar5;
  bool bVar6;
  Vector<float,_3> res;
  float afStack_98 [6];
  float local_80 [6];
  undefined8 local_68;
  undefined8 uStack_60;
  int local_50 [6];
  Matrix<float,_2,_2> local_38;
  float local_20;
  float local_1c;
  undefined4 local_18;
  float local_14;
  
  puVar1 = &local_68;
  local_68 = 0;
  uStack_60 = 0;
  puVar4 = &s_constInMat2;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)(puVar1 + lVar5) = puVar4[lVar5 * 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    puVar1 = (undefined8 *)((long)puVar1 + 4);
    puVar4 = puVar4 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  local_80[5] = local_68._4_4_ + uStack_60._4_4_;
  local_80[3] = (float)(undefined4)local_68;
  local_80[4] = (float)(undefined4)uStack_60;
  pfVar2 = (float *)&local_38;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  local_38.m_data.m_data[1].m_data[0] = 0.0;
  local_38.m_data.m_data[1].m_data[1] = 0.0;
  puVar4 = &s_constInMat2;
  lVar3 = 0;
  do {
    lVar5 = 0;
    do {
      pfVar2[lVar5 * 2] = (float)puVar4[lVar5 * 2];
      lVar5 = lVar5 + 1;
    } while (lVar5 == 1);
    pfVar2 = pfVar2 + 1;
    puVar4 = puVar4 + 1;
    bVar6 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar6);
  increment<float,2,2>((MatrixCaseUtils *)&local_20,&local_38);
  local_80[0] = local_20;
  local_80[1] = (float)local_18;
  local_80[2] = local_1c + local_14;
  afStack_98[2] = 0.0;
  afStack_98[3] = 0.0;
  afStack_98[4] = 0.0;
  lVar3 = 0;
  do {
    afStack_98[lVar3 + 2] = local_80[lVar3 + 3] + local_80[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  local_50[2] = 0;
  local_50[3] = 1;
  local_50[4] = 2;
  lVar3 = 2;
  do {
    (evalCtx->color).m_data[local_50[lVar3]] = afStack_98[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0)) + reduceToVec3(increment(getInputValue<In0Type, In0DataType>(evalCtx, 0)));
	}